

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O0

void __thiscall CppMLNN::run_train(CppMLNN *this,MatrixXd *train_examples,VectorXd *train_labels)

{
  pointer *this_00;
  Index *this_01;
  bool bVar1;
  double dVar2;
  result_type rVar3;
  ostream *poVar4;
  size_t sVar5;
  Index IVar6;
  Index blockRows;
  reference other;
  ulong uVar7;
  MatrixXd local_1538;
  undefined1 local_1520 [8];
  value_type y_p;
  undefined1 local_14e8 [8];
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  A;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  Z;
  ConstBlockXpr local_1480;
  ulong local_1448;
  size_t rand_sample;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  gradients;
  random_device rd;
  Matrix<double,__1,__1,_0,__1,__1> labels;
  undefined1 local_78 [8];
  Matrix<double,__1,__1,_0,__1,__1> examples;
  Matrix<double,__1,__1,_0,__1,__1> *all_labels;
  Matrix<double,__1,__1,_0,__1,__1> *all_examples;
  pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  input_data;
  VectorXd *train_labels_local;
  MatrixXd *train_examples_local;
  CppMLNN *this_local;
  
  input_data.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (Index)train_labels;
  poVar4 = std::operator<<((ostream *)&std::cout,"run_train");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  preprocess_data((pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   *)&all_examples,this,train_examples,
                  (VectorXd *)
                  input_data.second.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_cols);
  examples.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)&input_data.first.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_78,
             (Matrix<double,__1,__1,_0,__1,__1> *)&all_examples);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)((long)&rd.field_0 + 0x1380),
             (Matrix<double,__1,__1,_0,__1,__1> *)
             examples.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols);
  sVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&all_examples);
  this->m_examples = sVar5;
  sVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&all_examples);
  this->m_input_size = sVar5;
  poVar4 = std::operator<<((ostream *)&std::cout,"run_train");
  poVar4 = std::operator<<(poVar4,":: ");
  poVar4 = std::operator<<(poVar4,"start training...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::random_device::random_device
            ((random_device *)
             &gradients.
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    bVar1 = false;
    if ((0 < this->m_epoch_max) && (bVar1 = false, this->m_epoch < this->m_epoch_max)) {
      bVar1 = this->m_minimum_loss <= this->m_loss;
    }
    if (!bVar1) break;
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&rand_sample);
    if ((this->m_sgd_enabled & 1U) != 0) {
      rVar3 = std::random_device::operator()
                        ((random_device *)
                         &gradients.
                          super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&all_examples
                        );
      uVar7 = (ulong)rVar3 % (IVar6 - this->m_mini_batch_size);
      local_1448 = uVar7;
      IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&all_examples
                        );
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
                (&local_1480,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&all_examples,0
                 ,uVar7,IVar6,this->m_mini_batch_size);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                ((Matrix<double,_1,_1,0,_1,_1> *)local_78,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&local_1480);
      IVar6 = examples.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      uVar7 = local_1448;
      blockRows = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             examples.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::block
                ((ConstBlockXpr *)
                 &Z.
                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)IVar6,0,uVar7,blockRows,
                 this->m_mini_batch_size);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                ((Matrix<double,_1,_1,0,_1,_1> *)(rd.field_0.field2 + 0x1380),
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&Z.
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    this_00 = &A.
               super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)this_00);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_14e8);
    y_p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    this_01 = &y_p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
    ;
    std::
    vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
    ::vector((vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)this_01);
    forward_propagation(this,(MatrixXd *)local_78,
                        (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)this_00,
                        (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)local_14e8,
                        (vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                         *)this_01);
    std::
    vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
    ::~vector((vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               *)&y_p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
    other = std::
            vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::back((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_14e8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_1520,other);
    back_propagation(&local_1538,this,
                     (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)&A.
                         super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)local_14e8,(MatrixXd *)((long)&rd.field_0 + 0x1380),
                     (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)&rand_sample);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1538);
    this->m_epoch_batch = this->m_epoch_batch + 1;
    if ((this->m_epoch_batch * this->m_mini_batch_size) % this->m_examples == 0) {
      this->m_epoch = this->m_epoch + 1;
      dVar2 = loss(this,(MatrixXd *)local_1520,(MatrixXd *)((long)&rd.field_0 + 0x1380));
      this->m_loss = dVar2;
      if ((this->m_learn_rate_decay_enabled & 1U) != 0) {
        decay_learn_rate(this);
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"run_train");
      poVar4 = std::operator<<(poVar4,":: ");
      poVar4 = std::operator<<(poVar4,"epoch: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_epoch);
      poVar4 = std::operator<<(poVar4,"/");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_epoch_max);
      poVar4 = std::operator<<(poVar4,", loss: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_loss);
      std::operator<<(poVar4,"; ");
      poVar4 = std::operator<<((ostream *)&std::cout,"learning rate: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_learn_rate);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"run_train");
    poVar4 = std::operator<<(poVar4,":: ");
    poVar4 = std::operator<<(poVar4,"epoch: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_epoch);
    poVar4 = std::operator<<(poVar4,"/");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_epoch_max);
    poVar4 = std::operator<<(poVar4,", loss: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_loss);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_1520);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)local_14e8);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&A.
                  super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&rand_sample);
  }
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4,"run_train");
  poVar4 = std::operator<<(poVar4,":: ");
  poVar4 = std::operator<<(poVar4,"finish training model!");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::random_device::~random_device
            ((random_device *)
             &gradients.
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)((long)&rd.field_0 + 0x1380));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_78);
  std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  ~pair((pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *
        )&all_examples);
  return;
}

Assistant:

void CppMLNN::run_train(const MatrixXd &train_examples, const VectorXd &train_labels) {
	cout << __FUNCTION__ << endl;

	auto input_data = preprocess_data(train_examples, train_labels);
	const auto& all_examples = input_data.first;
	const auto& all_labels = input_data.second;
	auto examples = all_examples;
	auto labels = all_labels;

	m_examples = all_examples.cols();
	m_input_size = all_examples.rows();

	//check_gradient(examples, labels);
    
	cout << __FUNCTION__ << ":: " << "start training..." << endl;

    // loop to minimize loss function.
	random_device rd;
    while ((m_epoch_max > 0 && m_epoch < m_epoch_max) && m_loss >= m_minimum_loss) {
		vector<MatrixXd> gradients;

		if (m_sgd_enabled) {
			// perform mini-batch.
			auto rand_sample = rd() % (all_examples.cols() - m_mini_batch_size);
			examples = all_examples.block(0, rand_sample, all_examples.rows(), m_mini_batch_size);
			labels = all_labels.block(0, rand_sample, all_labels.rows(), m_mini_batch_size);
		}

		vector<MatrixXd> Z, A;
		forward_propagation(examples, Z, A);
		auto y_p = A.back();
		back_propagation(Z, A, labels, gradients);

		m_epoch_batch++;
		if ((m_epoch_batch * m_mini_batch_size) % m_examples == 0) {
			m_epoch++;

			m_loss = loss(y_p, labels);

			if (m_learn_rate_decay_enabled) decay_learn_rate();

			cout << __FUNCTION__ << ":: " << "epoch: " << m_epoch << "/" << m_epoch_max
				<< ", loss: " << m_loss << "; ";
			cout << "learning rate: " << m_learn_rate << endl;
		}

		cout << __FUNCTION__ << ":: " << "epoch: " << m_epoch << "/" << m_epoch_max
			<< ", loss: " << m_loss << endl;
    }

    cout << endl << __FUNCTION__ << ":: " << "finish training model!" << endl;
}